

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O3

bool RigidBodyDynamics::Math::LinSolveGaussElimPivot(MatrixNd *A,VectorNd *b,VectorNd *x)

{
  double dVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  ostream *poVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ActualDstType actualDst;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  void *pvVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  VectorNd px;
  long local_70;
  DenseStorage<double,__1,__1,_1,_0> local_40;
  
  lVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar10) {
    memset((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar10 << 3);
  }
  uVar2 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  uVar18 = (uint)uVar2;
  pvVar6 = operator_new__((uVar2 & 0xffffffff) << 3);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_40,(DenseStorage<double,__1,__1,_1,_0> *)x);
  auVar5 = _DAT_0018b220;
  if (uVar18 == 0) {
    pdVar8 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar10 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  }
  else {
    uVar13 = uVar2 & 0xffffffff;
    lVar10 = uVar13 - 1;
    auVar21._8_4_ = (int)lVar10;
    auVar21._0_8_ = lVar10;
    auVar21._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar9 = 0;
    auVar21 = auVar21 ^ _DAT_0018b220;
    auVar22 = _DAT_0018b210;
    do {
      auVar23 = auVar22 ^ auVar5;
      if ((bool)(~(auVar23._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar23._0_4_ ||
                  auVar21._4_4_ < auVar23._4_4_) & 1)) {
        *(ulong *)((long)pvVar6 + uVar9 * 8) = uVar9;
      }
      if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
          auVar23._12_4_ <= auVar21._12_4_) {
        *(ulong *)((long)pvVar6 + uVar9 * 8 + 8) = uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar10 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar10 + 2;
    } while ((uVar13 + 1 & 0xfffffffffffffffe) != uVar9);
    pdVar8 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar10 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    if (uVar18 != 0) {
      local_70 = 1;
      lVar11 = lVar10;
      uVar9 = 0;
      pvVar19 = pvVar6;
      do {
        dVar20 = ABS(pdVar8[uVar9 + *(long *)((long)pvVar6 + uVar9 * 8) * lVar11]);
        uVar15 = 0;
        do {
          lVar3 = *(long *)((long)pvVar19 + uVar15 * 8);
          dVar1 = pdVar8[uVar9 + lVar3 * lVar11];
          if (dVar20 < ABS(dVar1)) {
            uVar16 = *(uint *)((long)pvVar6 + uVar9 * 8);
            *(long *)((long)pvVar6 + uVar9 * 8) = lVar3;
            *(ulong *)((long)pvVar19 + uVar15 * 8) = (ulong)uVar16;
            dVar20 = ABS(dVar1);
          }
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
        uVar15 = uVar9 + 1;
        if (uVar15 < (uVar2 & 0xffffffff)) {
          lVar3 = *(long *)((long)pvVar6 + uVar9 * 8);
          lVar17 = local_70;
          do {
            if (ABS(pdVar8[lVar11 * lVar3 + uVar9]) <= 2.220446049250313e-16) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Error: pivoting failed for matrix A = ",0x26);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
              std::ostream::put(-0x70);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"A = ",4);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
              std::ostream::put(-0x70);
              poVar7 = (ostream *)std::ostream::flush();
              poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                 *)A);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"b = ",4);
              poVar7 = Eigen::operator<<((ostream *)&std::cerr,
                                         (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)b);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              pdVar8 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data;
              lVar10 = (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows;
            }
            lVar11 = lVar10 * lVar3;
            dVar20 = pdVar8[lVar11 + lVar17];
            dVar1 = pdVar8[lVar11 + uVar9];
            pdVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            pdVar4[lVar17] = pdVar4[lVar17] - pdVar4[uVar9] * (dVar20 / dVar1);
            uVar12 = 0;
            do {
              lVar11 = *(long *)((long)pvVar19 + uVar12 * 8) * lVar10;
              pdVar8[lVar11 + lVar17] =
                   pdVar8[lVar11 + lVar17] - pdVar8[lVar11 + uVar9] * (dVar20 / dVar1);
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar12);
            lVar17 = lVar17 + 1;
            lVar11 = lVar10;
          } while ((uint)lVar17 != uVar18);
        }
        local_70 = local_70 + 1;
        pvVar19 = (void *)((long)pvVar19 + 8);
        uVar13 = uVar13 - 1;
        uVar9 = uVar15;
      } while (uVar15 != (uVar2 & 0xffffffff));
    }
  }
  pdVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  iVar14 = 0;
  uVar9 = uVar2 & 0xffffffff;
  do {
    uVar16 = (uint)uVar9 - 1;
    uVar13 = (ulong)uVar16;
    if ((uint)uVar9 < uVar18) {
      dVar20 = local_40.m_data[uVar13];
      lVar11 = 0;
      do {
        dVar20 = dVar20 + pdVar8[uVar13 + *(long *)((long)pvVar6 + lVar11 * 8 + uVar9 * 8) * lVar10]
                          * local_40.m_data[uVar9 + lVar11];
        local_40.m_data[uVar13] = dVar20;
        lVar11 = lVar11 + 1;
      } while (iVar14 != (int)lVar11);
    }
    else {
      dVar20 = local_40.m_data[uVar13];
    }
    local_40.m_data[uVar13] =
         (pdVar4[uVar13] - dVar20) / pdVar8[*(long *)((long)pvVar6 + uVar13 * 8) * lVar10 + uVar13];
    iVar14 = iVar14 + 1;
    uVar9 = (ulong)uVar16;
  } while (uVar16 != 0);
  if (uVar18 != 0) {
    pdVar8 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar9 = 0;
    do {
      pdVar8[*(long *)((long)pvVar6 + uVar9 * 8)] = local_40.m_data[uVar9];
      uVar9 = uVar9 + 1;
    } while ((uVar2 & 0xffffffff) != uVar9);
  }
  operator_delete__(pvVar6);
  free(local_40.m_data);
  return true;
}

Assistant:

RBDL_DLLAPI bool LinSolveGaussElimPivot (MatrixNd A, VectorNd b, VectorNd &x) {
  x = VectorNd::Zero(x.size());

  // We can only solve quadratic systems
  assert (A.rows() == A.cols());

  unsigned int n = A.rows();
  unsigned int pi;

  // the pivots
  size_t *pivot = new size_t[n];

  // temporary result vector which contains the pivoted result
  VectorNd px(x);

  unsigned int i,j,k;

  for (i = 0; i < n; i++)
    pivot[i] = i;

  for (j = 0; j < n; j++) {
    pi = j;
    Scalar pv = fabs (A(j,pivot[j]));

    // LOG << "j = " << j << " pv = " << pv << std::endl;
    // find the pivot
    for (k = j; k < n; k++) {
      Scalar pt = fabs (A(j,pivot[k]));
      if (pt > pv) {
        pv = pt;
        pi = k;
        unsigned int p_swap = pivot[j];
        pivot[j] = pivot[pi];
        pivot[pi] = p_swap;
        //	LOG << "swap " << j << " with " << pi << std::endl;
        //	LOG << "j = " << j << " pv = " << pv << std::endl;
      }
    }

    for (i = j + 1; i < n; i++) {
      if (Scalar(fabs(A(j,pivot[j]))) <= Scalar(std::numeric_limits<double>::epsilon())) {
        std::cerr << "Error: pivoting failed for matrix A = " << std::endl;
        std::cerr << "A = " << std::endl << A << std::endl;
        std::cerr << "b = " << b << std::endl;
      }
      //		assert (fabs(A(j,pivot[j])) > std::numeric_limits<double>::epsilon());
      Scalar d = A(i,pivot[j])/A(j,pivot[j]);

      b[i] -= b[j] * d;

      for (k = j; k < n; k++) {
        A(i,pivot[k]) -= A(j,pivot[k]) * d;
      }
    }
  }

  // warning: i is an unsigned int, therefore a for loop of the 
  // form "for (i = n - 1; i >= 0; i--)" might end up in getting an invalid
  // value for i!
  i = n;
  do {
    i--;

    for (j = i + 1; j < n; j++) {
      px[i] += A(i,pivot[j]) * px[j];
    }
    px[i] = (b[i] - px[i]) / A(i,pivot[i]);

  } while (i > 0);

  // Unswapping
  for (i = 0; i < n; i++) {
    x[pivot[i]] = px[i];
  }

  /*
     LOG << "A = " << std::endl << A << std::endl;
     LOG << "b = " << b << std::endl;
     LOG << "x = " << x << std::endl;
     LOG << "pivot = " << pivot[0] << " " << pivot[1] << " " << pivot[2] << std::endl;
     std::cout << LogOutput.str() << std::endl;
     */

  delete[] pivot;

  return true;
}